

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O2

void __thiscall FileTokenizer::skipWhitespace(FileTokenizer *this)

{
  string *text;
  char cVar1;
  ulong uVar2;
  pointer pcVar3;
  bool bVar4;
  size_t sVar5;
  allocator<char> local_99;
  string local_98;
  Token local_78;
  
  text = &this->currentLine;
  sVar5 = this->linePos;
LAB_001447d0:
  do {
    uVar2 = (this->currentLine)._M_string_length;
    if (sVar5 < uVar2) {
      pcVar3 = (text->_M_dataplus)._M_p;
      cVar1 = pcVar3[sVar5];
      if ((cVar1 == ' ') || (cVar1 == '\t')) {
        do {
          sVar5 = sVar5 + 1;
          this->linePos = sVar5;
          if (uVar2 <= sVar5) break;
          cVar1 = pcVar3[sVar5];
        } while ((cVar1 == ' ') || (cVar1 == '\t'));
        goto LAB_001447d0;
      }
    }
    bVar4 = isComment(text,sVar5);
    if (bVar4) {
      sVar5 = (this->currentLine)._M_string_length;
    }
    else {
      bVar4 = isBlockComment(text,this->linePos);
      if (!bVar4) {
        return;
      }
      sVar5 = this->linePos + 2;
      this->linePos = sVar5;
      while( true ) {
        bVar4 = isBlockCommentEnd(text,sVar5);
        if (bVar4) break;
        sVar5 = this->linePos + 1;
        this->linePos = sVar5;
        if ((this->currentLine)._M_string_length <= sVar5) {
          bVar4 = isInputAtEnd(this);
          if (bVar4) {
            sVar5 = this->linePos;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_98,"Unexpected end of file in block comment",&local_99);
            createToken(this,Invalid,sVar5,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            Token::Token(&local_78,&this->token);
            std::__cxx11::list<Token,_std::allocator<Token>_>::push_back
                      ((list<Token,_std::allocator<Token>_> *)this,&local_78);
            Token::~Token(&local_78);
            return;
          }
          TextFile::readLine_abi_cxx11_(&local_98,this->input);
          std::__cxx11::string::operator=((string *)text,(string *)&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          this->linePos = 0;
          this->lineNumber = this->lineNumber + 1;
          sVar5 = 0;
        }
      }
      sVar5 = this->linePos + 2;
    }
    this->linePos = sVar5;
  } while( true );
}

Assistant:

void FileTokenizer::skipWhitespace()
{
	while (true)
	{
		if (isWhitespace(currentLine,linePos))
		{
			do { linePos++; } while (isWhitespace(currentLine,linePos));
		} else if (isComment(currentLine,linePos))
		{
			linePos = currentLine.size();
		} else if (isBlockComment(currentLine,linePos))
		{
			linePos += 2;
			while(!isBlockCommentEnd(currentLine,linePos))
			{
				linePos++;
				if (linePos >= currentLine.size())
				{
					if (isInputAtEnd())
					{
						createToken(TokenType::Invalid,linePos, "Unexpected end of file in block comment");
						addToken(token);
						return;
					}
					currentLine = input->readLine();
					linePos = 0;
					lineNumber++;
				}
			}
			linePos += 2;
		} else
		{
			break;
		}
	}
}